

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginPopupContextItem(char *str_id,int mouse_button)

{
  bool bVar1;
  ImGuiID flags;
  int in_ESI;
  char *in_RDI;
  ImGuiWindow *unaff_retaddr;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiID in_stack_00000034;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_RDI == (char *)0x0) {
    flags = (GImGui->CurrentWindow->DC).LastItemId;
  }
  else {
    flags = ImGuiWindow::GetID(unaff_retaddr,in_RDI,
                               (char *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  }
  bVar1 = IsMouseReleased(in_ESI);
  if ((bVar1) && (bVar1 = IsItemHovered(flags), bVar1)) {
    OpenPopupEx(in_stack_00000034);
  }
  bVar1 = BeginPopupEx((ImGuiID)window,id);
  return bVar1;
}

Assistant:

bool ImGui::BeginPopupContextItem(const char* str_id, int mouse_button)
{
    ImGuiWindow* window = GImGui->CurrentWindow;
    ImGuiID id = str_id ? window->GetID(str_id) : window->DC.LastItemId; // If user hasn't passed an ID, we can use the LastItemID. Using LastItemID as a Popup ID won't conflict!
    IM_ASSERT(id != 0);                                                  // You cannot pass a NULL str_id if the last item has no identifier (e.g. a Text() item)
    if (IsMouseReleased(mouse_button) && IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup))
        OpenPopupEx(id);
    return BeginPopupEx(id, ImGuiWindowFlags_AlwaysAutoResize|ImGuiWindowFlags_NoTitleBar|ImGuiWindowFlags_NoSavedSettings);
}